

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O1

basic_endpoint<boost::asio::ip::tcp> * __thiscall
libtorrent::detail::
read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
          (basic_endpoint<boost::asio::ip::tcp> *__return_storage_ptr__,detail *this,char **in)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ushort port_num;
  address addr;
  bytes_type bytes;
  address local_38;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar1 = *(long *)this + 1;
  lVar2 = 0;
  do {
    *(long *)this = lVar1;
    *(undefined1 *)((long)&local_18 + lVar2) = *(undefined1 *)(lVar1 + -1);
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x10);
  local_38.type_ = ipv6;
  local_38.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_38.ipv6_address_.addr_.__in6_u._0_8_ = local_18;
  local_38.ipv6_address_.addr_.__in6_u._8_8_ = uStack_10;
  local_38.ipv6_address_.scope_id_ = 0;
  iVar3 = 1;
  port_num = 0;
  do {
    port_num = (ushort)*(byte *)(lVar1 + -1) | port_num << 8;
    *(long *)this = lVar1;
    lVar1 = lVar1 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 == 0);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (__return_storage_ptr__,&local_38,port_num);
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v6_endpoint(InIt&& in)
		{
			address addr = read_v6_address(in);
			std::uint16_t port = read_uint16(in);
			return Endpoint(addr, port);
		}